

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varchar_data.hpp
# Opt level: O0

void duckdb::ArrowVarcharToStringViewData::Finalize
               (ArrowAppendData *append_data,LogicalType *type,ArrowArray *result)

{
  ArrowBuffer *pAVar1;
  data_ptr_t pdVar2;
  ArrowAppendData *this;
  long in_RDX;
  long in_RDI;
  
  *(undefined8 *)(in_RDX + 0x18) = 4;
  pAVar1 = ArrowAppendData::GetMainBuffer((ArrowAppendData *)0x153711a);
  pdVar2 = ArrowBuffer::data(pAVar1);
  *(data_ptr_t *)(*(long *)(in_RDX + 0x28) + 8) = pdVar2;
  pAVar1 = ArrowAppendData::GetAuxBuffer((ArrowAppendData *)0x153713c);
  pdVar2 = ArrowBuffer::data(pAVar1);
  *(data_ptr_t *)(*(long *)(in_RDX + 0x28) + 0x10) = pdVar2;
  this = (ArrowAppendData *)
         UnsafeNumericCast<long,unsigned_long,void>(*(unsigned_long *)(in_RDI + 0x128));
  pAVar1 = ArrowAppendData::GetBufferSizeBuffer(this);
  pdVar2 = ArrowBuffer::data(pAVar1);
  *(ArrowAppendData **)pdVar2 = this;
  pAVar1 = ArrowAppendData::GetBufferSizeBuffer(this);
  pdVar2 = ArrowBuffer::data(pAVar1);
  *(data_ptr_t *)(*(long *)(in_RDX + 0x28) + 0x18) = pdVar2;
  return;
}

Assistant:

static void Finalize(ArrowAppendData &append_data, const LogicalType &type, ArrowArray *result) {
		// We output four buffers
		result->n_buffers = 4;
		// Buffer 0 is the validity mask
		// Buffer 1 is our string views (short/long strings)
		result->buffers[1] = append_data.GetMainBuffer().data();
		// Buffer 2 is our only data buffer, could theoretically be more [ buffers ]
		result->buffers[2] = append_data.GetAuxBuffer().data();
		// Buffer 3 is the data-buffer lengths buffer, and we also populate it in to finalize
		reinterpret_cast<int64_t *>(append_data.GetBufferSizeBuffer().data())[0] =
		    UnsafeNumericCast<int64_t>(append_data.offset);
		result->buffers[3] = append_data.GetBufferSizeBuffer().data();
	}